

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * util::text_cap(string *__return_storage_ptr__,string *string,int width,string *elipses)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  
  pcVar1 = (string->_M_dataplus)._M_p;
  sVar4 = 0;
  iVar3 = 0;
  while( true ) {
    if (string->_M_string_length == sVar4) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)string);
      return __return_storage_ptr__;
    }
    iVar3 = iVar3 + *(int *)(sizes + (ulong)(byte)pcVar1[sVar4] * 4);
    if (width < iVar3) break;
    sVar4 = sVar4 + 1;
  }
  iVar2 = text_width(elipses);
  while( true ) {
    if ((iVar3 <= iVar2 + width) || (sVar4 == 0)) break;
    iVar3 = iVar3 - pcVar1[sVar4];
    sVar4 = sVar4 - 1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)string);
  return __return_storage_ptr__;
}

Assistant:

std::string text_cap(const std::string& string, int width, const std::string& elipses)
{
	int length = 0;

	for (std::size_t i = 0; i < string.length(); ++i)
	{
		length += sizes[string[i] & 0xFF];

		if (length > width)
		{
			int elipses_length = text_width(elipses);

			while (length > (width + elipses_length) && i > 0)
			{
				length -= string[i];
				--i;
			}

			return string.substr(0, i);
		}
	}

	return string;
}